

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandReadInit(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  FILE *__s;
  char *pcVar3;
  size_t sStack_30;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __s = (FILE *)Abc_FrameReadErr(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (globalUtilOptind + 1 == argc || globalUtilOptind == argc)) {
    if (pAVar2 != (Abc_Ntk_t *)0x0) {
      if (globalUtilOptind + 1 == argc) {
        pcVar3 = argv[globalUtilOptind];
      }
      else {
        if (pAVar2->pSpec == (char *)0x0) {
          puts("File name should be given on the command line.");
          return 1;
        }
        pcVar3 = Extra_FileNameGenericAppend(pAVar2->pSpec,".init");
      }
      pAVar2 = Abc_NtkDup(pAVar2);
      Io_ReadBenchInit(pAVar2,pcVar3);
      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
      Abc_FrameClearVerifStatus(pAbc);
      return 0;
    }
    pcVar3 = "Empty network.\n";
    sStack_30 = 0xf;
  }
  else {
    fwrite("usage: read_init [-h] <file>\n",0x1d,1,(FILE *)pAbc->Err);
    fwrite("\t         reads initial state of the network in BENCH format\n",0x3d,1,
           (FILE *)pAbc->Err);
    sStack_30 = 0x25;
    fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
    __s = (FILE *)pAbc->Err;
    pcVar3 = "\tfile   : the name of a file to read\n";
  }
  fwrite(pcVar3,sStack_30,1,__s);
  return 1;
}

Assistant:

int IoCommandReadInit( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pOut, * pErr;
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int c;

    pNtk = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind && argc != globalUtilOptind + 1 )
        goto usage;

    if ( pNtk == NULL )
    {
        fprintf( pErr, "Empty network.\n" );
        return 1;
    }
    // get the input file name
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else if ( pNtk->pSpec )
        pFileName = Extra_FileNameGenericAppend( pNtk->pSpec, ".init" );
    else
    {
        printf( "File name should be given on the command line.\n" );
        return 1;
    }

    // read the file using the corresponding file reader
    pNtk = Abc_NtkDup( pNtk );
    Io_ReadBenchInit( pNtk, pFileName );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_init [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         reads initial state of the network in BENCH format\n" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}